

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TextColoredV(ImVec4 *col,char *fmt,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  
  PushStyleColor(0,col);
  if (((*fmt == '%') && (fmt[1] == 's')) && (fmt[2] == '\0')) {
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar2 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar2 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar2 + 1;
    }
    TextEx((char *)*puVar2,(char *)0x0,1);
  }
  else {
    TextV(fmt,args);
  }
  PopStyleColor(1);
  return;
}

Assistant:

void ImGui::TextColoredV(const ImVec4& col, const char* fmt, va_list args)
{
    PushStyleColor(ImGuiCol_Text, col);
    if (fmt[0] == '%' && fmt[1] == 's' && fmt[2] == 0)
        TextEx(va_arg(args, const char*), NULL, ImGuiTextFlags_NoWidthForLargeClippedText); // Skip formatting
    else
        TextV(fmt, args);
    PopStyleColor();
}